

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,LogLevel ll)

{
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  LogLevel local_14;
  string *psStack_10;
  LogLevel ll_local;
  
  local_14 = ll;
  psStack_10 = __return_storage_ptr__;
  if (ll == Warning) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[Warning] ",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (ll == Error) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[Error] ",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[Log] ",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const LogLevel ll) {
	switch (ll) {
		case LogLevel::Warning:
			return "[Warning] ";
		case LogLevel::Error:
			return "[Error] ";
	}
	return "[Log] ";
}